

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::ModeAdd
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this,idx_t row)

{
  ColumnDataScanState *pCVar1;
  size_t sVar2;
  char *pcVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  string_t *psVar7;
  ulong uVar8;
  uint uVar9;
  string_t *psVar10;
  key_type k;
  
  pCVar1 = this->scan;
  if ((pCVar1->next_row_index <= row) || (uVar5 = pCVar1->current_row_index, row < uVar5)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)row,(DataChunk *)pCVar1);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(string_t **)(pvVar4 + 0x20);
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = (ValidityMask *)(pvVar4 + 0x28);
    uVar5 = this->scan->current_row_index;
  }
  uVar9 = (int)row - (int)uVar5;
  psVar10 = this->data;
  k.value.pointer.ptr = psVar10[uVar9].value.pointer.ptr;
  k.value._0_8_ = *(undefined8 *)&psVar10[uVar9].value;
  pmVar6 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::GetOrCreate(this->frequency_map,k);
  sVar2 = pmVar6->count;
  uVar5 = sVar2 + 1;
  pmVar6->count = uVar5;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar6->first_row = row;
  }
  else {
    uVar8 = pmVar6->first_row;
    if (row < pmVar6->first_row) {
      uVar8 = row;
    }
    pmVar6->first_row = uVar8;
  }
  if (this->count < uVar5) {
    psVar10 = psVar10 + uVar9;
    this->valid = true;
    this->count = uVar5;
    psVar7 = this->mode;
    if (psVar7 == (string_t *)0x0) {
      psVar7 = (string_t *)operator_new(0x10);
      pcVar3 = (psVar10->value).pointer.ptr;
      *(undefined8 *)&psVar7->value = *(undefined8 *)&psVar10->value;
      (psVar7->value).pointer.ptr = pcVar3;
      this->mode = psVar7;
    }
    else {
      pcVar3 = (psVar10->value).pointer.ptr;
      *(undefined8 *)&psVar7->value = *(undefined8 *)&psVar10->value;
      (psVar7->value).pointer.ptr = pcVar3;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}